

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signingprovider.cpp
# Opt level: O0

bool __thiscall
FillableSigningProvider::AddCScript(FillableSigningProvider *this,CScript *redeemScript)

{
  string_view source_file;
  size_type sVar1;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *in_RDI;
  long in_FS_OFFSET;
  string_view in_stack_00000000;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock4;
  Level in_stack_000000e0;
  uint *in_stack_000000f0;
  undefined4 in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff3c;
  CScript *in_stack_ffffffffffffff40;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *in_stack_ffffffffffffff48;
  CScriptID *in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff5c;
  map<CScriptID,_CScript,_std::less<CScriptID>,_std::allocator<std::pair<const_CScriptID,_CScript>_>_>
  *in_stack_ffffffffffffff60;
  char *in_stack_ffffffffffffff68;
  AnnotatedMixin<std::recursive_mutex> *in_stack_ffffffffffffff70;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *flag;
  int in_stack_ffffffffffffffac;
  byte bVar2;
  ConstevalFormatString<1U> in_stack_ffffffffffffffe8;
  size_t in_stack_fffffffffffffff0;
  char *pcVar3;
  
  pcVar3 = *(char **)(in_FS_OFFSET + 0x28);
  flag = in_RDI;
  sVar1 = prevector<28U,_unsigned_char,_unsigned_int,_int>::size(in_stack_ffffffffffffff48);
  if (sVar1 < 0x209) {
    MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
              ((AnnotatedMixin<std::recursive_mutex> *)
               CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
    UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
              (in_RDI,in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
               (char *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c,
               SUB41((uint)in_stack_ffffffffffffff58 >> 0x18,0));
    CScriptID::CScriptID(in_stack_ffffffffffffff50,(CScript *)in_stack_ffffffffffffff48);
    std::
    map<CScriptID,_CScript,_std::less<CScriptID>,_std::allocator<std::pair<const_CScriptID,_CScript>_>_>
    ::operator[](in_stack_ffffffffffffff60,
                 (key_type *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    CScript::operator=((CScript *)in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
    bVar2 = 1;
    UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
              ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)
               CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  }
  else {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)
               CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
               (char *)in_stack_ffffffffffffff50);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)
               CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
               (char *)in_stack_ffffffffffffff50);
    source_file._M_str = pcVar3;
    source_file._M_len = in_stack_fffffffffffffff0;
    LogPrintFormatInternal<unsigned_int>
              (in_stack_00000000,source_file,in_stack_ffffffffffffffac,(LogFlags)flag,
               in_stack_000000e0,in_stack_ffffffffffffffe8,in_stack_000000f0);
    bVar2 = 0;
  }
  if (*(char **)(in_FS_OFFSET + 0x28) == pcVar3) {
    return (bool)(bVar2 & 1);
  }
  __stack_chk_fail();
}

Assistant:

bool FillableSigningProvider::AddCScript(const CScript& redeemScript)
{
    if (redeemScript.size() > MAX_SCRIPT_ELEMENT_SIZE) {
        LogError("FillableSigningProvider::AddCScript(): redeemScripts > %i bytes are invalid\n", MAX_SCRIPT_ELEMENT_SIZE);
        return false;
    }

    LOCK(cs_KeyStore);
    mapScripts[CScriptID(redeemScript)] = redeemScript;
    return true;
}